

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixIO.cpp
# Opt level: O2

string * __thiscall
ZXing::ToSVG_abi_cxx11_(string *__return_storage_ptr__,ZXing *this,BitMatrix *matrix)

{
  bool bVar1;
  ostream *poVar2;
  int x;
  int x_00;
  int iVar3;
  int y;
  int iVar4;
  ostringstream out;
  ostringstream local_1a8 [376];
  
  iVar3 = *(int *)this;
  iVar4 = *(int *)(this + 4);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar2 = std::operator<<((ostream *)local_1a8,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  poVar2 = std::operator<<(poVar2,
                           "<svg xmlns=\"http://www.w3.org/2000/svg\" version=\"1.1\" viewBox=\"0 0 "
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
  poVar2 = std::operator<<(poVar2,"\" stroke=\"none\">\n");
  std::operator<<(poVar2,"<path d=\"");
  y = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  for (; y != iVar4; y = y + 1) {
    for (x_00 = 0; iVar3 != x_00; x_00 = x_00 + 1) {
      bVar1 = BitMatrix::get((BitMatrix *)this,x_00,y);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)local_1a8,"M");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,x_00);
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,y);
        std::operator<<(poVar2,"h1v1h-1z");
      }
    }
  }
  std::operator<<((ostream *)local_1a8,"\"/>\n</svg>");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string ToSVG(const BitMatrix& matrix)
{
	// see https://stackoverflow.com/questions/10789059/create-qr-code-in-vector-image/60638350#60638350

	const int width = matrix.width();
	const int height = matrix.height();
	std::ostringstream out;

	out << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
		<< "<svg xmlns=\"http://www.w3.org/2000/svg\" version=\"1.1\" viewBox=\"0 0 " << width << " " << height
		<< "\" stroke=\"none\">\n"
		<< "<path d=\"";

	for (int y = 0; y < height; ++y)
		for (int x = 0; x < width; ++x)
			if (matrix.get(x, y))
				out << "M" << x << "," << y << "h1v1h-1z";

	out << "\"/>\n</svg>";

	return out.str();
}